

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
get_alignment_heads_by_layer
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          whisper_context_params *cparams,int il,int n_text_layer,int n_head)

{
  whisper_alignment_heads_preset wVar1;
  size_t sVar2;
  whisper_ahead *pwVar3;
  undefined8 in_RAX;
  mapped_type *pmVar4;
  int iVar5;
  size_t i;
  size_t sVar6;
  undefined8 local_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wVar1 = cparams->dtw_aheads_preset;
  if (wVar1 != WHISPER_AHEADS_NONE) {
    local_38 = in_RAX;
    if (wVar1 == WHISPER_AHEADS_CUSTOM) {
      pmVar4 = &cparams->dtw_aheads;
    }
    else {
      if (wVar1 == WHISPER_AHEADS_N_TOP_MOST) {
        if (il < n_text_layer - cparams->dtw_n_top) {
          return __return_storage_ptr__;
        }
        iVar5 = 0;
        if (n_head < 1) {
          n_head = iVar5;
        }
        for (; n_head != iVar5; iVar5 = iVar5 + 1) {
          local_38 = CONCAT44(iVar5,(uint)local_38);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (__return_storage_ptr__,(uint *)((long)&local_38 + 4));
        }
        return __return_storage_ptr__;
      }
      pmVar4 = std::
               map<whisper_alignment_heads_preset,_whisper_aheads,_std::less<whisper_alignment_heads_preset>,_std::allocator<std::pair<const_whisper_alignment_heads_preset,_whisper_aheads>_>_>
               ::at(&g_aheads,&cparams->dtw_aheads_preset);
    }
    sVar2 = pmVar4->n_heads;
    pwVar3 = pmVar4->heads;
    for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
      if (pwVar3[sVar6].n_text_layer == il) {
        local_38 = CONCAT44(local_38._4_4_,pwVar3[sVar6].n_head);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (__return_storage_ptr__,(uint *)&local_38);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<uint32_t> get_alignment_heads_by_layer(const whisper_context_params & cparams, int il, int n_text_layer, int n_head) {
    std::vector<uint32_t> ret;
    if (cparams.dtw_aheads_preset == WHISPER_AHEADS_NONE) {
        return ret;
    } else if (cparams.dtw_aheads_preset == WHISPER_AHEADS_N_TOP_MOST) {
        if (il >= n_text_layer - cparams.dtw_n_top) {
            for (int32_t i = 0; i < n_head; ++i) {
                ret.push_back(i);
            }
        }
    } else {
        const auto aheads = cparams.dtw_aheads_preset == WHISPER_AHEADS_CUSTOM ? cparams.dtw_aheads : g_aheads.at(cparams.dtw_aheads_preset);
        for (size_t i = 0; i < aheads.n_heads; ++i) {
            if (aheads.heads[i].n_text_layer == il) {
                ret.push_back(aheads.heads[i].n_head);
            }
        }
    }
    return ret;
}